

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::detail::
storage_t<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::destruct_value
          (storage_t<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this)

{
  value_type *this_00;
  storage_t<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this_local;
  
  this_00 = value_ptr(this);
  tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable(this_00);
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }